

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_line_ended_undo(Parser *this)

{
  size_t *psVar1;
  char cVar2;
  pfn_error p_Var3;
  code *pcVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  State *pSVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  size_t sVar16;
  byte bVar17;
  csubstr cVar18;
  char *pcStack_120;
  size_t local_118;
  char *pcStack_f8;
  size_t local_f0;
  char *pcStack_d0;
  size_t local_c8;
  char *pcStack_a8;
  size_t local_a0;
  char msg [39];
  
  bVar17 = 0;
  pSVar10 = this->m_state;
  if ((pSVar10->pos).super_LineCol.col != 1) {
    builtin_strncpy(msg,"check failed: (m_state->pos.col == 1u)",0x27);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    p_Var3 = (this->m_stack).m_callbacks.m_error;
    cVar18 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_a0 = cVar18.len;
    pcStack_a8 = cVar18.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x76ae) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x76ae) << 0x40,8);
    LVar5.name.str = pcStack_a8;
    LVar5.name.len = local_a0;
    (*p_Var3)(msg,0x27,LVar5,(this->m_stack).m_callbacks.m_user_data);
    pSVar10 = this->m_state;
  }
  if ((pSVar10->pos).super_LineCol.line == 0) {
    builtin_strncpy(msg,"check failed: (m_state->pos.line > 0u)",0x27);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    p_Var3 = (this->m_stack).m_callbacks.m_error;
    cVar18 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_c8 = cVar18.len;
    pcStack_d0 = cVar18.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x76af) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x76af) << 0x40,8);
    LVar6.name.str = pcStack_d0;
    LVar6.name.len = local_c8;
    (*p_Var3)(msg,0x27,LVar6,(this->m_stack).m_callbacks.m_user_data);
    pSVar10 = this->m_state;
  }
  uVar13 = (pSVar10->pos).super_LineCol.offset;
  sVar16 = (pSVar10->line_contents).full.len;
  sVar12 = (pSVar10->line_contents).stripped.len;
  if (uVar13 < sVar16 - sVar12) {
    pcVar14 = 
    "check failed: (m_state->pos.offset >= m_state->line_contents.full.len - m_state->line_contents.stripped.len)"
    ;
    pcVar15 = msg;
    for (lVar11 = 0x6d; lVar11 != 0; lVar11 = lVar11 + -1) {
      *pcVar15 = *pcVar14;
      pcVar14 = pcVar14 + (ulong)bVar17 * -2 + 1;
      pcVar15 = pcVar15 + (ulong)bVar17 * -2 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    p_Var3 = (this->m_stack).m_callbacks.m_error;
    cVar18 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_f0 = cVar18.len;
    pcStack_f8 = cVar18.str;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x76b0) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x76b0) << 0x40,8);
    LVar7.name.str = pcStack_f8;
    LVar7.name.len = local_f0;
    (*p_Var3)(msg,0x6d,LVar7,(this->m_stack).m_callbacks.m_user_data);
    pSVar10 = this->m_state;
    uVar13 = (pSVar10->pos).super_LineCol.offset;
    sVar16 = (pSVar10->line_contents).full.len;
    sVar12 = (pSVar10->line_contents).stripped.len;
  }
  sVar16 = (sVar12 - sVar16) + uVar13;
  (pSVar10->pos).super_LineCol.offset = sVar16;
  psVar1 = &(pSVar10->pos).super_LineCol.line;
  *psVar1 = *psVar1 - 1;
  (pSVar10->pos).super_LineCol.col = sVar12 + 1;
  uVar13 = (this->m_buf).len;
  if (((sVar16 < uVar13) && (cVar2 = (this->m_buf).str[sVar16], cVar2 != '\n')) && (cVar2 != '\r'))
  {
    pcVar14 = 
    "check failed: (m_state->pos.offset >= m_buf.len || m_buf[m_state->pos.offset] == \'\\n\' || m_buf[m_state->pos.offset] == \'\\r\')"
    ;
    pcVar15 = msg;
    for (lVar11 = 0x7d; lVar11 != 0; lVar11 = lVar11 + -1) {
      *pcVar15 = *pcVar14;
      pcVar14 = pcVar14 + (ulong)bVar17 * -2 + 1;
      pcVar15 = pcVar15 + (ulong)bVar17 * -2 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    p_Var3 = (this->m_stack).m_callbacks.m_error;
    cVar18 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_118 = cVar18.len;
    pcStack_120 = cVar18.str;
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x76b7) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x76b7) << 0x40,8);
    LVar8.name.str = pcStack_120;
    LVar8.name.len = local_118;
    (*p_Var3)(msg,0x7d,LVar8,(this->m_stack).m_callbacks.m_user_data);
    pSVar10 = this->m_state;
    sVar16 = (pSVar10->pos).super_LineCol.offset;
    uVar13 = (this->m_buf).len;
  }
  if (sVar16 <= uVar13) {
    (pSVar10->line_contents).rem.str = (this->m_buf).str + sVar16;
    (pSVar10->line_contents).rem.len = 0;
    return;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar9 = is_debugger_attached();
    if (bVar9) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
  }
  handle_error(0x1e6196,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x153a,"first >= 0 && first <= len");
}

Assistant:

void Parser::_line_ended_undo()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col == 1u);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.line > 0u);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= m_state->line_contents.full.len - m_state->line_contents.stripped.len);
    size_t delta = m_state->line_contents.full.len - m_state->line_contents.stripped.len;
    _c4dbgpf("line[{}] undo ended! line {}-->{}, offset {}-->{}", m_state->pos.line, m_state->pos.line, m_state->pos.line - 1, m_state->pos.offset, m_state->pos.offset - delta);
    m_state->pos.offset -= delta;
    --m_state->pos.line;
    m_state->pos.col = m_state->line_contents.stripped.len + 1u;
    // don't forget to undo also the changes to the remainder of the line
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= m_buf.len || m_buf[m_state->pos.offset] == '\n' || m_buf[m_state->pos.offset] == '\r');
    m_state->line_contents.rem = m_buf.sub(m_state->pos.offset, 0);
}